

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void __thiscall
mp::LinTerms::
unfold_from<gch::small_vector<std::pair<int,double>,256u,std::allocator<std::pair<int,double>>>>
          (LinTerms *this,
          small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator c;
  small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *in_RDI;
  pair<int,_double> *v;
  const_iterator __end0;
  const_iterator __begin0;
  small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *__range2;
  LinTerms *in_stack_ffffffffffffffd0;
  
  clear(in_stack_ffffffffffffffd0);
  gch::small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_>::size
            ((small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *
             )0x511cc6);
  reserve(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  this_00 = gch::
            small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_>::
            begin(in_RDI);
  c = gch::small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_>::end
                (in_RDI);
  while( true ) {
    bVar1 = gch::operator!=((small_vector_iterator<const_std::pair<int,_double>_*,_long> *)
                            in_stack_ffffffffffffffd0,
                            (small_vector_iterator<const_std::pair<int,_double>_*,_long> *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (LinTerms *)
         gch::small_vector_iterator<const_std::pair<int,_double>_*,_long>::operator*
                   ((small_vector_iterator<const_std::pair<int,_double>_*,_long> *)0x511d19);
    add_term((LinTerms *)this_00.m_ptr,(double)c.m_ptr,
             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    gch::small_vector_iterator<const_std::pair<int,_double>_*,_long>::operator++
              ((small_vector_iterator<const_std::pair<int,_double>_*,_long> *)
               &stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void LinTerms::unfold_from(const Vec& vec) {
  clear();
  reserve(vec.size());
  for (const auto& v: vec)
    add_term(v.second, v.first);
}